

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

int Gia_ManComputeOneWin
              (Gia_Man_t *pGia,int iPivot,Vec_Int_t **pvRoots,Vec_Int_t **pvNodes,
              Vec_Int_t **pvLeaves,Vec_Int_t **pvAnds)

{
  Spl_Man_t *p;
  Vec_Int_t *pVVar1;
  int iVar2;
  
  p = (Spl_Man_t *)pGia->pSatlutWinman;
  if (p == (Spl_Man_t *)0x0) {
    __assert_fail("p != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x207,
                  "int Gia_ManComputeOneWin(Gia_Man_t *, int, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  if (iPivot == -1) {
    Spl_ManStop(p);
    pGia->pSatlutWinman = (void *)0x0;
  }
  else {
    iVar2 = Spl_ManComputeOne(p,iPivot);
    if (iVar2 != 0) {
      *pvRoots = p->vRoots;
      *pvNodes = p->vNodes;
      *pvLeaves = p->vLeaves;
      pVVar1 = p->vAnds;
      *pvAnds = pVVar1;
      return pVVar1->nSize;
    }
    *pvRoots = (Vec_Int_t *)0x0;
    *pvNodes = (Vec_Int_t *)0x0;
    *pvLeaves = (Vec_Int_t *)0x0;
    *pvAnds = (Vec_Int_t *)0x0;
  }
  return 0;
}

Assistant:

int Gia_ManComputeOneWin( Gia_Man_t * pGia, int iPivot, Vec_Int_t ** pvRoots, Vec_Int_t ** pvNodes, Vec_Int_t ** pvLeaves, Vec_Int_t ** pvAnds )
{
    Spl_Man_t * p = (Spl_Man_t *)pGia->pSatlutWinman;
    assert( p != NULL );
    if ( iPivot == -1 )
    {
        Spl_ManStop( p );
        pGia->pSatlutWinman = NULL;
        return 0;
    }
    if ( !Spl_ManComputeOne( p, iPivot ) )
    {
        *pvRoots  = NULL;
        *pvNodes  = NULL;
        *pvLeaves = NULL;
        *pvAnds   = NULL;
        return 0;
    }
    *pvRoots  = p->vRoots;
    *pvNodes  = p->vNodes;
    *pvLeaves = p->vLeaves;
    *pvAnds   = p->vAnds;
    // Vec_IntPrint( p->vNodes );
    return Vec_IntSize(p->vAnds);
}